

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::MessageLite> *pRVar2;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  LogMessage *pLVar3;
  CppType *pCVar4;
  CppType *pCVar5;
  MessageLite *pMVar6;
  undefined1 auVar7 [16];
  LogMessageFatal local_d8 [23];
  Voidify local_c1;
  CppType local_c0;
  CppType local_bc;
  string *local_b8;
  undefined1 local_b0 [16];
  LogMessageFatal local_a0 [23];
  Voidify local_89;
  anon_enum_32 local_88;
  anon_enum_32 local_84;
  string *local_80;
  string *absl_log_internal_check_op_result_1;
  undefined1 local_68 [16];
  LogMessageFatal local_58 [23];
  Voidify local_41;
  CppType local_40;
  CppType local_3c;
  string *local_38;
  string *absl_log_internal_check_op_result;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  MessageLite *prototype_local;
  FieldType type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)descriptor;
  descriptor_local = (FieldDescriptor *)prototype;
  prototype_local._3_1_ = type;
  prototype_local._4_4_ = number;
  pEStack_10 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,(Extension **)&absl_log_internal_check_op_result)
  ;
  if (bVar1) {
    *(FieldType *)&absl_log_internal_check_op_result->_M_string_length = prototype_local._3_1_;
    local_3c = anon_unknown_58::cpp_type
                         ((FieldType)absl_log_internal_check_op_result->_M_string_length);
    pCVar4 = absl::lts_20240722::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_3c);
    local_40 = CPPTYPE_MESSAGE;
    pCVar5 = absl::lts_20240722::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_40);
    local_38 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (pCVar4,pCVar5,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (local_38 != (string *)0x0) {
      local_68 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x34a,local_68._0_8_,local_68._8_8_);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_58);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_41,pLVar3);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
    }
    *(undefined1 *)((long)&absl_log_internal_check_op_result->_M_string_length + 1) = 1;
    *(byte *)((long)&absl_log_internal_check_op_result->_M_string_length + 2) =
         *(byte *)((long)&absl_log_internal_check_op_result->_M_string_length + 2) & 0xfe | 1;
    pRVar2 = Arena::Create<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                       (this->arena_);
    *(RepeatedPtrField<google::protobuf::MessageLite> **)absl_log_internal_check_op_result = pRVar2;
  }
  else {
    local_84 = (anon_enum_32)((absl_log_internal_check_op_result->_M_string_length & 0x100) == 0);
    v1 = absl::lts_20240722::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_84);
    local_88 = REPEATED_FIELD;
    v2 = absl::lts_20240722::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_88);
    local_80 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                         (v1,v2,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                         );
    if (local_80 != (string *)0x0) {
      local_b0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x350,local_b0._0_8_,local_b0._8_8_);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_a0);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_89,pLVar3);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a0);
    }
    local_bc = anon_unknown_58::cpp_type
                         ((FieldType)absl_log_internal_check_op_result->_M_string_length);
    pCVar4 = absl::lts_20240722::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_bc);
    local_c0 = CPPTYPE_MESSAGE;
    pCVar5 = absl::lts_20240722::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_c0);
    local_b8 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (pCVar4,pCVar5,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (local_b8 != (string *)0x0) {
      auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b8);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x350,auVar7._0_8_,auVar7._8_8_);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_d8);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_c1,pLVar3);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_d8);
    }
    local_b8 = (string *)0x0;
  }
  pMVar6 = RepeatedPtrFieldBase::AddMessage
                     (*(RepeatedPtrFieldBase **)absl_log_internal_check_op_result,
                      (MessageLite *)descriptor_local);
  return pMVar6;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->ptr.repeated_message_value =
        Arena::Create<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  return reinterpret_cast<internal::RepeatedPtrFieldBase*>(
             extension->ptr.repeated_message_value)
      ->AddMessage(&prototype);
}